

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satVec.h
# Opt level: O0

void veci_push(veci *v,int e)

{
  int iVar1;
  int *local_28;
  int local_1c;
  int newsize;
  int e_local;
  veci *v_local;
  
  if (v->size == v->cap) {
    if (v->cap < 4) {
      local_1c = v->cap << 1;
    }
    else {
      local_1c = (v->cap / 2) * 3;
    }
    if (v->ptr == (int *)0x0) {
      local_28 = (int *)malloc((long)local_1c << 2);
    }
    else {
      local_28 = (int *)realloc(v->ptr,(long)local_1c << 2);
    }
    v->ptr = local_28;
    if (v->ptr == (int *)0x0) {
      printf("Failed to realloc memory from %.1f MB to %.1f MB.\n",
             ((double)v->cap * 1.0) / 1048576.0,((double)local_1c * 1.0) / 1048576.0);
      fflush(_stdout);
    }
    v->cap = local_1c;
  }
  iVar1 = v->size;
  v->size = iVar1 + 1;
  v->ptr[iVar1] = e;
  return;
}

Assistant:

static inline void   veci_push   (veci* v, int e)
{
    if (v->size == v->cap) {
//        int newsize = v->cap * 2;//+1;
        int newsize = (v->cap < 4) ? v->cap * 2 : (v->cap / 2) * 3;
        v->ptr = ABC_REALLOC( int, v->ptr, newsize );
        if ( v->ptr == NULL )
        {
            printf( "Failed to realloc memory from %.1f MB to %.1f MB.\n", 
                1.0 * v->cap / (1<<20), 1.0 * newsize / (1<<20) );
            fflush( stdout );
        }
        v->cap = newsize; }
    v->ptr[v->size++] = e;
}